

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::RegisterGenerator
          (CommandLineInterface *this,string *flag_name,CodeGenerator *generator,string *help_text)

{
  mapped_type *pmVar1;
  GeneratorInfo info;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  CodeGenerator *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  std::__cxx11::string::_M_assign((string *)&local_98);
  local_58 = generator;
  std::__cxx11::string::_M_assign((string *)&local_50);
  pmVar1 = absl::lts_20250127::container_internal::
           btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
           ::operator[]<std::__cxx11::string>
                     ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
                       *)&this->generators_by_flag_name_,flag_name);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->option_flag_name);
  pmVar1->generator = local_58;
  std::__cxx11::string::_M_assign((string *)&pmVar1->help_text);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

void CommandLineInterface::RegisterGenerator(const std::string& flag_name,
                                             CodeGenerator* generator,
                                             const std::string& help_text) {
  GeneratorInfo info;
  info.flag_name = flag_name;
  info.generator = generator;
  info.help_text = help_text;
  generators_by_flag_name_[flag_name] = info;
}